

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::UpdateWitnessStackRequest::UpdateWitnessStackRequest
          (UpdateWitnessStackRequest *this)

{
  allocator local_11;
  UpdateWitnessStackRequest *local_10;
  UpdateWitnessStackRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__UpdateWitnessStackRequest_01b41d40;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tx_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->is_elements_ = false;
  UpdateWitnessStackTxInRequest::UpdateWitnessStackTxInRequest(&this->txin_);
  CollectFieldName();
  return;
}

Assistant:

UpdateWitnessStackRequest() {
    CollectFieldName();
  }